

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O0

int expect(frozen *f,char *s,int len,json_type t)

{
  int iVar1;
  int _n_1;
  int _n;
  int n;
  int i;
  json_type t_local;
  int len_local;
  char *s_local;
  frozen *f_local;
  
  iVar1 = left(f);
  f_local._4_4_ = capture_ptr(f,f->cur,t);
  if (-1 < f_local._4_4_) {
    for (_n = 0; _n < len; _n = _n + 1) {
      if (iVar1 <= _n) {
        return -2;
      }
      if (f->cur[_n] != s[_n]) {
        return -1;
      }
    }
    f->cur = f->cur + len;
    f_local._4_4_ = capture_len(f,f->num_tokens + -1,f->cur);
    if (-1 < f_local._4_4_) {
      f_local._4_4_ = 0;
    }
  }
  return f_local._4_4_;
}

Assistant:

static int expect(struct frozen *f, const char *s, int len, enum json_type t) {
    int i, n = left(f);

    TRY(capture_ptr(f, f->cur, t));
    for (i = 0; i < len; i++) {
        if (i >= n) return JSON_STRING_INCOMPLETE;
        if (f->cur[i] != s[i]) return JSON_STRING_INVALID;
    }
    f->cur += len;
    TRY(capture_len(f, f->num_tokens - 1, f->cur));

    return 0;
}